

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

HRESULT __thiscall
Js::ScriptContext::TrySerializeParserState
          (ScriptContext *this,uint sourceCRC,LPCUTF8 pszSrc,size_t cbLength,SRCINFO *srcInfo,
          ParseableFunctionInfo *func,byte *parserStateCacheBuffer,DWORD parserStateCacheByteCount,
          SimpleDataCacheWrapper *pDataCache)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (func == (ParseableFunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x8f7,"(func != nullptr)","func != nullptr");
    if (!bVar2) goto LAB_0078a082;
    *puVar3 = 0;
  }
  if (pDataCache == (SimpleDataCacheWrapper *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x8f8,"(pDataCache != nullptr)","pDataCache != nullptr");
    if (!bVar2) {
LAB_0078a082:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return -0x7fffbffb;
}

Assistant:

HRESULT ScriptContext::TrySerializeParserState(
        _In_ uint sourceCRC,
        _In_reads_bytes_(cbLength) LPCUTF8 pszSrc,
        _In_ size_t cbLength,
        _In_ SRCINFO *srcInfo,
        _In_ Js::ParseableFunctionInfo* func,
        _In_reads_bytes_(parserStateCacheByteCount) byte* parserStateCacheBuffer,
        _In_ DWORD parserStateCacheByteCount,
        _In_ Js::SimpleDataCacheWrapper* pDataCache)
    {
        HRESULT hr = E_FAIL;

        Assert(func != nullptr);
        Assert(pDataCache != nullptr);

#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        byte* serializeParserStateCacheBuffer = parserStateCacheBuffer;
        DWORD serializeParserStateCacheSize = parserStateCacheByteCount;
        DWORD dwFlags = GENERATE_BYTE_CODE_PARSER_STATE | GENERATE_BYTE_CODE_ALLOC_ANEW;
        DebugOnly(auto url = !srcInfo->sourceContextInfo->isHostDynamicDocument ? srcInfo->sourceContextInfo->url : this->GetUrl());

        // If we already have a parser state cache serialized into a buffer, we should skip creating it again
        if (parserStateCacheBuffer == nullptr)
        {
            Assert(serializeParserStateCacheSize == 0);

            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Trying to serialize parser state cache for '%s'\n"), url);

            BEGIN_TEMP_ALLOCATOR(tempAllocator, this, _u("ByteCodeSerializer"));
            hr = Js::ByteCodeSerializer::SerializeToBuffer(this,
                tempAllocator, (DWORD)cbLength, pszSrc, func->GetFunctionBody(),
                func->GetHostSrcInfo(), &serializeParserStateCacheBuffer,
                &serializeParserStateCacheSize, dwFlags);
            END_TEMP_ALLOCATOR(tempAllocator, this);

            if (FAILED(hr))
            {
                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to serialize parser state cache (hr = 0x%08lx) for '%s'\n"), hr, url);
                return hr;
            }

            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Successfully serialized parser state cache for '%s'\n"), url);
        }
        else
        {
            Assert(serializeParserStateCacheSize != 0);

            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Skip serializing parser state cache since deserialized cache is available for '%s'\n"), url);
        }

        OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Trying to write parser state cache (%lu bytes) to stream for '%s'\n"), serializeParserStateCacheSize, url);

        BEGIN_TEMP_ALLOCATOR(tempAllocator, this, _u("ByteCodeSerializer"));
        {
            byte* compressedBuffer = nullptr;
            size_t compressedSize = 0;

            if (CONFIG_FLAG(CompressParserStateCache))
            {
                hr = Js::CompressionUtilities::CompressBuffer(tempAllocator, serializeParserStateCacheBuffer, serializeParserStateCacheSize, &compressedBuffer, &compressedSize);

                if (FAILED(hr))
                {
                    OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to compress parser state cache (hr = 0x%08lx) for '%s'\n"), hr, url);
                    goto ExitTempAllocator;
                }

                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Compressed parser state cache %lu -> %lu bytes (%.2f%%) to stream for '%s'\n"), serializeParserStateCacheSize, compressedSize, (double)compressedSize / serializeParserStateCacheSize * 100.0, url);
            }
            else
            {
                // Don't compress, just pass through the parser state cache buffer
                compressedBuffer = serializeParserStateCacheBuffer;
                compressedSize = serializeParserStateCacheSize;
            }

            hr = pDataCache->StartBlock(Js::SimpleDataCacheWrapper::BlockType_ParserState, (ULONG)compressedSize + sizeof(uint));

            if (FAILED(hr))
            {
                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to write a block to the parser state cache data stream (hr = 0x%08lx) for '%s'\n"), hr, url);
                goto ExitTempAllocator;
            }

            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Computed CRC value = 0x%08lx for '%s'\n"), sourceCRC, url);

            hr = pDataCache->Write(sourceCRC);

            if (FAILED(hr))
            {
                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to write CRC data to the data stream (hr = 0x%08lx) for '%s'\n"), hr, url);
                goto ExitTempAllocator;
            }

            hr = pDataCache->WriteArray(compressedBuffer, (ULONG)compressedSize);

            if (FAILED(hr))
            {
                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to write compressed parser state cache (hr = 0x%08lx) for '%s'\n"), hr, url);
                goto ExitTempAllocator;
            }
        }
ExitTempAllocator:
        END_TEMP_ALLOCATOR(tempAllocator, this);

        if (FAILED(hr))
        {
            return hr;
        }

        OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Successfully wrote parser state cache for '%s'\n"), url);
#endif

        return hr;
    }